

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateBinaryUsingContextAndValidationState
          (spv_context_t *context,uint32_t *words,size_t num_words,spv_diagnostic *pDiagnostic,
          ValidationState_t *vstate)

{
  Instruction *pIVar1;
  spv_position_t position_00;
  spv_position_t position_01;
  spv_position_t position_02;
  spv_position_t position_03;
  ulong uVar2;
  undefined4 uVar3;
  unique_ptr<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_> this;
  bool bVar4;
  __type _Var5;
  spv_result_t sVar6;
  uint32_t uVar7;
  Op OVar8;
  uint uVar9;
  ExecutionModel execution_model_00;
  pointer psVar10;
  DiagnosticStream *pDVar11;
  spv_const_validator_options psVar12;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *pvVar13;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_00;
  size_type sVar14;
  spv_parsed_operand_t *psVar15;
  reference ppIVar16;
  Function *pFVar17;
  BasicBlock *pBVar18;
  value_type *pvVar19;
  const_reference pvVar20;
  reference inst_00;
  bool local_16e2;
  bool local_16e1;
  spv_result_t error_43;
  spv_result_t error_42;
  spv_result_t error_41;
  Instruction *inst_2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *__range2_1;
  spv_result_t error_40;
  spv_result_t error_39;
  spv_result_t error_38;
  spv_result_t error_37;
  spv_result_t error_36;
  spv_result_t error_35;
  spv_result_t error_34;
  spv_result_t error_33;
  spv_result_t error_32;
  spv_result_t error_31;
  spv_result_t error_30;
  spv_result_t error_29;
  spv_result_t error_28;
  spv_result_t error_27;
  spv_result_t error_26;
  spv_result_t error_25;
  spv_result_t error_24;
  spv_result_t error_23;
  spv_result_t error_22;
  spv_result_t error_21;
  spv_result_t error_20;
  spv_result_t error_19;
  spv_result_t error_18;
  spv_result_t error_17;
  spv_result_t error_16;
  spv_result_t error_15;
  spv_result_t error_14;
  spv_result_t error_13;
  spv_result_t error_12;
  spv_result_t error_11;
  spv_result_t error_10;
  spv_result_t error_9;
  spv_result_t error_8;
  value_type *instruction_2;
  size_t i_1;
  spv_result_t error_7;
  value_type *instruction_1;
  size_t i;
  undefined1 local_15a0 [4];
  spv_result_t error_6;
  DiagnosticStream local_1580;
  DiagnosticStream local_13a8;
  DiagnosticStream local_11d0;
  DiagnosticStream local_ff8;
  Instruction *local_e20;
  Instruction *inst_1;
  spv_result_t error_5;
  spv_result_t error_4;
  spv_result_t error_3;
  spv_result_t error_2;
  spv_result_t error_1;
  uint called_id;
  DiagnosticStream local_c28;
  undefined1 local_a50 [8];
  string check_name;
  ExecutionModel check_execution_model;
  Instruction *check_inst;
  iterator __end6;
  iterator __begin6;
  vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> *__range6;
  ulong local_a00;
  size_t j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> interfaces;
  EntryPointDescription desc;
  string desc_name;
  ExecutionModel execution_model;
  uint entry_point;
  Instruction *inst;
  Instruction *instruction;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *__range2;
  vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
  visited_entry_points;
  bool has_mask_task_ext;
  bool has_mask_task_nv;
  spv_result_t error;
  spv_context_t hijacked_context;
  string local_8e8;
  undefined8 local_8c8;
  size_t local_8c0;
  size_t local_8b8;
  DiagnosticStream local_8b0;
  char *local_6d8;
  uint local_6cc;
  uint local_6c8;
  allocator<char> local_6c1;
  string local_6c0;
  undefined8 local_6a0;
  size_t local_698;
  size_t local_690;
  DiagnosticStream local_688;
  allocator<char> local_4a9;
  string local_4a8;
  undefined8 local_488;
  size_t local_480;
  size_t local_478;
  DiagnosticStream local_470;
  undefined1 local_298 [8];
  spv_header_t header;
  string local_270;
  undefined8 local_250;
  size_t local_248;
  size_t local_240;
  DiagnosticStream local_238;
  undefined8 local_60;
  spv_position_t position;
  spv_endianness_t endian;
  unique_ptr<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_> binary;
  ValidationState_t *vstate_local;
  spv_diagnostic *pDiagnostic_local;
  size_t num_words_local;
  uint32_t *words_local;
  spv_context_t *context_local;
  
  binary._M_t.super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>.
  _M_t.super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>.
  super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl =
       (__uniq_ptr_data<spv_const_binary_t,_std::default_delete<spv_const_binary_t>,_true,_true>)
       (__uniq_ptr_data<spv_const_binary_t,_std::default_delete<spv_const_binary_t>,_true,_true>)
       vstate;
  psVar10 = (pointer)operator_new(0x10);
  psVar10->code = words;
  psVar10->wordCount = num_words;
  std::unique_ptr<spv_const_binary_t,std::default_delete<spv_const_binary_t>>::
  unique_ptr<std::default_delete<spv_const_binary_t>,void>
            ((unique_ptr<spv_const_binary_t,std::default_delete<spv_const_binary_t>> *)
             &stack0xffffffffffffffc0,psVar10);
  memset(&local_60,0,0x18);
  psVar10 = std::unique_ptr<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>::get
                      ((unique_ptr<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_> *)
                       &stack0xffffffffffffffc0);
  sVar6 = spvBinaryEndianness(psVar10,(spv_endianness_t *)((long)&position.index + 4));
  if (sVar6 == SPV_SUCCESS) {
    psVar10 = std::unique_ptr<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>::get
                        ((unique_ptr<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_> *
                         )&stack0xffffffffffffffc0);
    sVar6 = spvBinaryHeaderGet(psVar10,position.index._4_4_,(spv_header_t *)local_298);
    uVar3 = local_298._4_4_;
    if (sVar6 == SPV_SUCCESS) {
      uVar7 = spvVersionForTargetEnv(context->target_env);
      if (uVar7 < (uint)uVar3) {
        local_6a0 = local_60;
        local_698 = position.line;
        local_690 = position.column;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"",&local_6c1);
        position_02.column = local_698;
        position_02.line = local_6a0;
        position_02.index = local_690;
        DiagnosticStream::DiagnosticStream
                  (&local_688,position_02,&context->consumer,&local_6c0,SPV_ERROR_WRONG_VERSION);
        pDVar11 = DiagnosticStream::operator<<
                            (&local_688,(char (*) [31])"Invalid SPIR-V binary version ");
        local_6c8 = (uint)local_298._4_4_ >> 0x10 & 0xff;
        pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_6c8);
        pDVar11 = DiagnosticStream::operator<<(pDVar11,(char (*) [2])0x3cdc5b);
        local_6cc = (uint)local_298._4_4_ >> 8 & 0xff;
        pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_6cc);
        pDVar11 = DiagnosticStream::operator<<(pDVar11,(char (*) [25])" for target environment ");
        local_6d8 = spvTargetEnvDescription(context->target_env);
        pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_6d8);
        pDVar11 = DiagnosticStream::operator<<(pDVar11,(char (*) [2])0x3cdc5b);
        context_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
        DiagnosticStream::~DiagnosticStream(&local_688);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::allocator<char>::~allocator(&local_6c1);
        header.instructions._0_4_ = 1;
      }
      else {
        psVar12 = ValidationState_t::options
                            ((ValidationState_t *)
                             binary._M_t.
                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl);
        if ((psVar12->universal_limits_).max_id_bound < header.version) {
          local_8c8 = local_60;
          local_8c0 = position.line;
          local_8b8 = position.column;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8e8,"",
                     (allocator<char> *)((long)&hijacked_context.consumer._M_invoker + 7));
          position_03.column = local_8c0;
          position_03.line = local_8c8;
          position_03.index = local_8b8;
          DiagnosticStream::DiagnosticStream
                    (&local_8b0,position_03,&context->consumer,&local_8e8,SPV_ERROR_INVALID_BINARY);
          pDVar11 = DiagnosticStream::operator<<
                              (&local_8b0,
                               (char (*) [63])
                               "Invalid SPIR-V.  The id bound is larger than the max id bound ");
          psVar12 = ValidationState_t::options
                              ((ValidationState_t *)
                               binary._M_t.
                               super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                               .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl);
          pDVar11 = DiagnosticStream::operator<<(pDVar11,&(psVar12->universal_limits_).max_id_bound)
          ;
          pDVar11 = DiagnosticStream::operator<<(pDVar11,(char (*) [2])0x3cdc5b);
          context_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
          DiagnosticStream::~DiagnosticStream(&local_8b0);
          std::__cxx11::string::~string((string *)&local_8e8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&hijacked_context.consumer._M_invoker + 7));
          header.instructions._0_4_ = 1;
        }
        else {
          spv_context_t::spv_context_t((spv_context_t *)&error,context);
          std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>::
          operator=((function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>
                     *)&hijacked_context.ext_inst_table,(anon_class_1_0_00000001 *)&has_mask_task_nv
                   );
          spvBinaryParse((spv_const_context)&error,
                         (void *)binary._M_t.
                                 super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                 .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,
                         words,num_words,(spv_parsed_header_fn_t)0x0,ProcessExtensions,
                         (spv_diagnostic *)0x0);
          sVar6 = spvBinaryParse(context,(void *)binary._M_t.
                                                 super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                                 .super__Head_base<0UL,_spv_const_binary_t_*,_false>
                                                 ._M_head_impl,words,num_words,
                                 (spv_parsed_header_fn_t)0x0,ProcessInstruction,pDiagnostic);
          if (sVar6 == SPV_SUCCESS) {
            visited_entry_points.
            super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
            visited_entry_points.
            super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
            std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
            ::vector((vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                      *)&__range2);
            pvVar13 = ValidationState_t::ordered_instructions
                                ((ValidationState_t *)
                                 binary._M_t.
                                 super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                 .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl);
            __end2 = std::
                     vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                     ::begin(pvVar13);
            instruction = (Instruction *)
                          std::
                          vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                          ::end(pvVar13);
            while (bVar4 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                                               *)&instruction), bVar4) {
              _execution_model =
                   __gnu_cxx::
                   __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                   ::operator*(&__end2);
              inst = _execution_model;
              OVar8 = Instruction::opcode(_execution_model);
              if (OVar8 == OpEntryPoint) {
                uVar9 = Instruction::GetOperandAs<unsigned_int>(_execution_model,1);
                execution_model_00 =
                     Instruction::GetOperandAs<spv::ExecutionModel>(_execution_model,0);
                Instruction::GetOperandAs<std::__cxx11::string>
                          ((string *)
                           &desc.interfaces.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,_execution_model,2);
                ValidationState_t::EntryPointDescription::EntryPointDescription
                          ((EntryPointDescription *)
                           &interfaces.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
                std::__cxx11::string::operator=
                          ((string *)
                           &interfaces.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                           (string *)
                           &desc.interfaces.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j);
                local_a00 = 3;
                while( true ) {
                  uVar2 = local_a00;
                  this_00 = Instruction::operands(_execution_model);
                  sVar14 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ::size(this_00);
                  pIVar1 = _execution_model;
                  if (sVar14 <= uVar2) break;
                  psVar15 = Instruction::operand(_execution_model,local_a00);
                  __range6._4_4_ = Instruction::word(pIVar1,(ulong)psVar15->offset);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             ((long)&desc.name.field_2 + 8),
                             (value_type_conflict2 *)((long)&__range6 + 4));
                  local_a00 = local_a00 + 1;
                }
                ValidationState_t::RegisterEntryPoint
                          ((ValidationState_t *)
                           binary._M_t.
                           super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                           .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,uVar9,
                           execution_model_00,
                           (EntryPointDescription *)
                           &interfaces.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
                sVar14 = std::
                         vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                         ::size((vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                                 *)&__range2);
                if (sVar14 != 0) {
                  __end6 = std::
                           vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                           ::begin((vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                                    *)&__range2);
                  check_inst = (Instruction *)
                               std::
                               vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                               ::end((vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                                      *)&__range2);
                  while (bVar4 = __gnu_cxx::operator!=
                                           (&__end6,(
                                                  __normal_iterator<spvtools::val::Instruction_**,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>
                                                  *)&check_inst), bVar4) {
                    ppIVar16 = __gnu_cxx::
                               __normal_iterator<spvtools::val::Instruction_**,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>
                               ::operator*(&__end6);
                    pIVar1 = *ppIVar16;
                    check_name.field_2._12_4_ =
                         Instruction::GetOperandAs<spv::ExecutionModel>(pIVar1,0);
                    Instruction::GetOperandAs<std::__cxx11::string>((string *)local_a50,pIVar1,2);
                    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&desc.interfaces.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_a50);
                    if ((_Var5) && (execution_model_00 == check_name.field_2._12_4_)) {
                      ValidationState_t::diag
                                (&local_c28,
                                 (ValidationState_t *)
                                 binary._M_t.
                                 super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                 .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,
                                 SPV_ERROR_INVALID_DATA,_execution_model);
                      pDVar11 = DiagnosticStream::operator<<
                                          (&local_c28,
                                           (char (*) [61])
                                           "2 Entry points cannot share the same name and ExecutionMode."
                                          );
                      context_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11)
                      ;
                      DiagnosticStream::~DiagnosticStream(&local_c28);
                      header.instructions._0_4_ = 1;
                    }
                    else {
                      header.instructions._0_4_ = 0;
                    }
                    std::__cxx11::string::~string((string *)local_a50);
                    if ((int)header.instructions != 0) goto LAB_0025c7b1;
                    __gnu_cxx::
                    __normal_iterator<spvtools::val::Instruction_**,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>
                    ::operator++(&__end6);
                  }
                }
                std::
                vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                ::push_back((vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                             *)&__range2,(value_type *)&execution_model);
                local_16e1 = execution_model_00 == ExecutionModelTaskNV ||
                             execution_model_00 == ExecutionModelMeshNV;
                visited_entry_points.
                super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
                     (visited_entry_points.
                      super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0 ||
                     local_16e1;
                local_16e2 = execution_model_00 == ExecutionModelTaskEXT ||
                             execution_model_00 == ExecutionModelMeshEXT;
                visited_entry_points.
                super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
                     (visited_entry_points.
                      super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0 ||
                     local_16e2;
                header.instructions._0_4_ = 0;
LAB_0025c7b1:
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j);
                ValidationState_t::EntryPointDescription::~EntryPointDescription
                          ((EntryPointDescription *)
                           &interfaces.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
                std::__cxx11::string::~string
                          ((string *)
                           &desc.interfaces.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
                if ((int)header.instructions != 0) goto LAB_0025d5e9;
              }
              OVar8 = Instruction::opcode(_execution_model);
              if (OVar8 == OpFunctionCall) {
                bVar4 = ValidationState_t::in_function_body
                                  ((ValidationState_t *)
                                   binary._M_t.
                                   super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                   .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl)
                ;
                if (!bVar4) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&error_1,
                             (ValidationState_t *)
                             binary._M_t.
                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,
                             SPV_ERROR_INVALID_LAYOUT,inst);
                  pDVar11 = DiagnosticStream::operator<<
                                      ((DiagnosticStream *)&error_1,
                                       (char (*) [51])
                                       "A FunctionCall must happen within a function body.");
                  context_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_1);
                  header.instructions._0_4_ = 1;
                  goto LAB_0025d5e9;
                }
                error_2 = Instruction::GetOperandAs<unsigned_int>(_execution_model,2);
                ValidationState_t::AddFunctionCallTarget
                          ((ValidationState_t *)
                           binary._M_t.
                           super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                           .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,error_2)
                ;
              }
              bVar4 = ValidationState_t::in_function_body
                                ((ValidationState_t *)
                                 binary._M_t.
                                 super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                 .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl);
              pIVar1 = _execution_model;
              if (bVar4) {
                pFVar17 = ValidationState_t::current_function
                                    ((ValidationState_t *)
                                     binary._M_t.
                                     super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                     .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                     _M_head_impl);
                Instruction::set_function(pIVar1,pFVar17);
                pIVar1 = _execution_model;
                pFVar17 = ValidationState_t::current_function
                                    ((ValidationState_t *)
                                     binary._M_t.
                                     super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                     .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                     _M_head_impl);
                pBVar18 = Function::current_block(pFVar17);
                Instruction::set_block(pIVar1,pBVar18);
                bVar4 = ValidationState_t::in_block
                                  ((ValidationState_t *)
                                   binary._M_t.
                                   super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                   .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl)
                ;
                if (bVar4) {
                  OVar8 = Instruction::opcode(_execution_model);
                  bVar4 = spvOpcodeIsBlockTerminator(OVar8);
                  if (bVar4) {
                    pFVar17 = ValidationState_t::current_function
                                        ((ValidationState_t *)
                                         binary._M_t.
                                         super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                         .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                         _M_head_impl);
                    pBVar18 = Function::current_block(pFVar17);
                    BasicBlock::set_terminator(pBVar18,_execution_model);
                  }
                }
              }
              error_3 = IdPass((ValidationState_t *)
                               binary._M_t.
                               super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                               .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,
                               _execution_model);
              if (error_3 != SPV_SUCCESS) {
                header.instructions._0_4_ = 1;
                context_local._4_4_ = error_3;
                goto LAB_0025d5e9;
              }
              error_4 = CapabilityPass((ValidationState_t *)
                                       binary._M_t.
                                       super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                       .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                       _M_head_impl,inst);
              if (error_4 != SPV_SUCCESS) {
                header.instructions._0_4_ = 1;
                context_local._4_4_ = error_4;
                goto LAB_0025d5e9;
              }
              error_5 = ModuleLayoutPass((ValidationState_t *)
                                         binary._M_t.
                                         super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                         .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                         _M_head_impl,inst);
              if (error_5 != SPV_SUCCESS) {
                header.instructions._0_4_ = 1;
                context_local._4_4_ = error_5;
                goto LAB_0025d5e9;
              }
              inst_1._4_4_ = CfgPass((ValidationState_t *)
                                     binary._M_t.
                                     super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                     .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                     _M_head_impl,inst);
              if (inst_1._4_4_ != SPV_SUCCESS) {
                header.instructions._0_4_ = 1;
                context_local._4_4_ = inst_1._4_4_;
                goto LAB_0025d5e9;
              }
              inst_1._0_4_ = InstructionPass((ValidationState_t *)
                                             binary._M_t.
                                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                             _M_head_impl,inst);
              if ((spv_result_t)inst_1 != SPV_SUCCESS) {
                header.instructions._0_4_ = 1;
                context_local._4_4_ = (spv_result_t)inst_1;
                goto LAB_0025d5e9;
              }
              local_e20 = inst;
              ValidationState_t::RegisterInstruction
                        ((ValidationState_t *)
                         binary._M_t.
                         super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                         .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,inst);
              OVar8 = Instruction::opcode(local_e20);
              this = binary;
              if (OVar8 == OpTypeForwardPointer) {
                uVar9 = Instruction::GetOperandAs<unsigned_int>(local_e20,0);
                ValidationState_t::RegisterForwardPointer
                          ((ValidationState_t *)
                           this._M_t.
                           super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                           .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,uVar9);
              }
              __gnu_cxx::
              __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
              ::operator++(&__end2);
            }
            bVar4 = ValidationState_t::has_memory_model_specified
                              ((ValidationState_t *)
                               binary._M_t.
                               super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                               .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl);
            if (bVar4) {
              bVar4 = ValidationState_t::in_function_body
                                ((ValidationState_t *)
                                 binary._M_t.
                                 super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                 .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl);
              if (bVar4) {
                ValidationState_t::diag
                          (&local_11d0,
                           (ValidationState_t *)
                           binary._M_t.
                           super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                           .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,
                           SPV_ERROR_INVALID_LAYOUT,(Instruction *)0x0);
                pDVar11 = DiagnosticStream::operator<<
                                    (&local_11d0,
                                     (char (*) [40])"Missing OpFunctionEnd at end of module.");
                context_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
                DiagnosticStream::~DiagnosticStream(&local_11d0);
                header.instructions._0_4_ = 1;
              }
              else {
                bVar4 = ValidationState_t::HasCapability
                                  ((ValidationState_t *)
                                   binary._M_t.
                                   super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                   .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,
                                   BindlessTextureNV);
                if ((!bVar4) ||
                   (bVar4 = ValidationState_t::has_samplerimage_variable_address_mode_specified
                                      ((ValidationState_t *)
                                       binary._M_t.
                                       super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                       .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                       _M_head_impl), bVar4)) {
                  if (((visited_entry_points.
                        super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) ||
                     ((visited_entry_points.
                       super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0)) {
                    context_local._4_4_ =
                         ValidateForwardDecls
                                   ((ValidationState_t *)
                                    binary._M_t.
                                    super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                    .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl
                                   );
                    if (context_local._4_4_ == SPV_SUCCESS) {
                      ReachabilityPass((ValidationState_t *)
                                       binary._M_t.
                                       super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                       .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                       _M_head_impl);
                      instruction_1 = (value_type *)0x0;
                      while( true ) {
                        pvVar13 = ValidationState_t::ordered_instructions
                                            ((ValidationState_t *)
                                             binary._M_t.
                                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                             _M_head_impl);
                        pvVar19 = (value_type *)
                                  std::
                                  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                                  ::size(pvVar13);
                        if (pvVar19 <= instruction_1) break;
                        pvVar13 = ValidationState_t::ordered_instructions
                                            ((ValidationState_t *)
                                             binary._M_t.
                                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                             _M_head_impl);
                        pvVar20 = std::
                                  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                                  ::operator[](pvVar13,(size_type)instruction_1);
                        context_local._4_4_ =
                             UpdateIdUse((ValidationState_t *)
                                         binary._M_t.
                                         super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                         .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                         _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        instruction_1 =
                             (value_type *)
                             ((long)&(instruction_1->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1);
                      }
                      instruction_2 = (value_type *)0x0;
                      while( true ) {
                        pvVar13 = ValidationState_t::ordered_instructions
                                            ((ValidationState_t *)
                                             binary._M_t.
                                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                             _M_head_impl);
                        pvVar19 = (value_type *)
                                  std::
                                  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                                  ::size(pvVar13);
                        if (pvVar19 <= instruction_2) break;
                        pvVar13 = ValidationState_t::ordered_instructions
                                            ((ValidationState_t *)
                                             binary._M_t.
                                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                             _M_head_impl);
                        pvVar20 = std::
                                  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                                  ::operator[](pvVar13,(size_type)instruction_2);
                        context_local._4_4_ =
                             MiscPass((ValidationState_t *)
                                      binary._M_t.
                                      super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                      .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                      _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             DebugPass((ValidationState_t *)
                                       binary._M_t.
                                       super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                       .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                       _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             AnnotationPass((ValidationState_t *)
                                            binary._M_t.
                                            super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                            .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                            _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             ExtensionPass((ValidationState_t *)
                                           binary._M_t.
                                           super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                           .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                           _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             ModeSettingPass((ValidationState_t *)
                                             binary._M_t.
                                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                             _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             TypePass((ValidationState_t *)
                                      binary._M_t.
                                      super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                      .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                      _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             ConstantPass((ValidationState_t *)
                                          binary._M_t.
                                          super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                          .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                          _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             MemoryPass((ValidationState_t *)
                                        binary._M_t.
                                        super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                        .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                        _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             FunctionPass((ValidationState_t *)
                                          binary._M_t.
                                          super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                          .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                          _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             ImagePass((ValidationState_t *)
                                       binary._M_t.
                                       super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                       .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                       _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             ConversionPass((ValidationState_t *)
                                            binary._M_t.
                                            super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                            .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                            _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             CompositesPass((ValidationState_t *)
                                            binary._M_t.
                                            super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                            .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                            _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             ArithmeticsPass((ValidationState_t *)
                                             binary._M_t.
                                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                             _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             BitwisePass((ValidationState_t *)
                                         binary._M_t.
                                         super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                         .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                         _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             LogicalsPass((ValidationState_t *)
                                          binary._M_t.
                                          super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                          .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                          _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             ControlFlowPass((ValidationState_t *)
                                             binary._M_t.
                                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                             _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             DerivativesPass((ValidationState_t *)
                                             binary._M_t.
                                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                             _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             AtomicsPass((ValidationState_t *)
                                         binary._M_t.
                                         super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                         .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                         _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             PrimitivesPass((ValidationState_t *)
                                            binary._M_t.
                                            super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                            .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                            _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             BarriersPass((ValidationState_t *)
                                          binary._M_t.
                                          super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                          .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                          _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             NonUniformPass((ValidationState_t *)
                                            binary._M_t.
                                            super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                            .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                            _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             LiteralsPass((ValidationState_t *)
                                          binary._M_t.
                                          super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                          .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                          _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             RayQueryPass((ValidationState_t *)
                                          binary._M_t.
                                          super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                          .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                          _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             RayTracingPass((ValidationState_t *)
                                            binary._M_t.
                                            super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                            .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                            _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             RayReorderNVPass((ValidationState_t *)
                                              binary._M_t.
                                              super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                              .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                              _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        context_local._4_4_ =
                             MeshShadingPass((ValidationState_t *)
                                             binary._M_t.
                                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                             _M_head_impl,pvVar20);
                        if (context_local._4_4_ != SPV_SUCCESS) {
                          header.instructions._0_4_ = 1;
                          goto LAB_0025d5e9;
                        }
                        instruction_2 =
                             (value_type *)
                             ((long)&(instruction_2->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1);
                      }
                      context_local._4_4_ =
                           ValidateAdjacency((ValidationState_t *)
                                             binary._M_t.
                                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                             _M_head_impl);
                      if (context_local._4_4_ == SPV_SUCCESS) {
                        context_local._4_4_ =
                             ValidateEntryPoints((ValidationState_t *)
                                                 binary._M_t.
                                                 super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                                 .super__Head_base<0UL,_spv_const_binary_t_*,_false>
                                                 ._M_head_impl);
                        if (context_local._4_4_ == SPV_SUCCESS) {
                          context_local._4_4_ =
                               PerformCfgChecks((ValidationState_t *)
                                                binary._M_t.
                                                super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                                .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                                _M_head_impl);
                          if (context_local._4_4_ == SPV_SUCCESS) {
                            context_local._4_4_ =
                                 CheckIdDefinitionDominateUse
                                           ((ValidationState_t *)
                                            binary._M_t.
                                            super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                            .super__Head_base<0UL,_spv_const_binary_t_*,_false>.
                                            _M_head_impl);
                            if (context_local._4_4_ == SPV_SUCCESS) {
                              context_local._4_4_ =
                                   ValidateDecorations((ValidationState_t *)
                                                       binary._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                                  .
                                                  super__Head_base<0UL,_spv_const_binary_t_*,_false>
                                                  ._M_head_impl);
                              if (context_local._4_4_ == SPV_SUCCESS) {
                                context_local._4_4_ =
                                     ValidateInterfaces((ValidationState_t *)
                                                        binary._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                                  .
                                                  super__Head_base<0UL,_spv_const_binary_t_*,_false>
                                                  ._M_head_impl);
                                if (context_local._4_4_ == SPV_SUCCESS) {
                                  context_local._4_4_ =
                                       ValidateBuiltIns((ValidationState_t *)
                                                        binary._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                                  .
                                                  super__Head_base<0UL,_spv_const_binary_t_*,_false>
                                                  ._M_head_impl);
                                  if (context_local._4_4_ == SPV_SUCCESS) {
                                    pvVar13 = ValidationState_t::ordered_instructions
                                                        ((ValidationState_t *)
                                                         binary._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                                  .
                                                  super__Head_base<0UL,_spv_const_binary_t_*,_false>
                                                  ._M_head_impl);
                                    __end2_1 = std::
                                               vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                                               ::begin(pvVar13);
                                    inst_2 = (Instruction *)
                                             std::
                                             vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                                             ::end(pvVar13);
                                    while (bVar4 = __gnu_cxx::operator!=
                                                             (&__end2_1,
                                                              (
                                                  __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                                                  *)&inst_2), bVar4) {
                                      inst_00 = __gnu_cxx::
                                                __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                                                ::operator*(&__end2_1);
                                      context_local._4_4_ =
                                           ValidateExecutionLimitations
                                                     ((ValidationState_t *)
                                                      binary._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                                  .
                                                  super__Head_base<0UL,_spv_const_binary_t_*,_false>
                                                  ._M_head_impl,inst_00);
                                      if (context_local._4_4_ != SPV_SUCCESS) {
                                        header.instructions._0_4_ = 1;
                                        goto LAB_0025d5e9;
                                      }
                                      context_local._4_4_ =
                                           ValidateSmallTypeUses
                                                     ((ValidationState_t *)
                                                      binary._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                                  .
                                                  super__Head_base<0UL,_spv_const_binary_t_*,_false>
                                                  ._M_head_impl,inst_00);
                                      if (context_local._4_4_ != SPV_SUCCESS) {
                                        header.instructions._0_4_ = 1;
                                        goto LAB_0025d5e9;
                                      }
                                      context_local._4_4_ =
                                           ValidateQCOMImageProcessingTextureUsages
                                                     ((ValidationState_t *)
                                                      binary._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                                                  .
                                                  super__Head_base<0UL,_spv_const_binary_t_*,_false>
                                                  ._M_head_impl,inst_00);
                                      if (context_local._4_4_ != SPV_SUCCESS) {
                                        header.instructions._0_4_ = 1;
                                        goto LAB_0025d5e9;
                                      }
                                      __gnu_cxx::
                                      __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                                      ::operator++(&__end2_1);
                                    }
                                    context_local._4_4_ = SPV_SUCCESS;
                                    header.instructions._0_4_ = 1;
                                  }
                                  else {
                                    header.instructions._0_4_ = 1;
                                  }
                                }
                                else {
                                  header.instructions._0_4_ = 1;
                                }
                              }
                              else {
                                header.instructions._0_4_ = 1;
                              }
                            }
                            else {
                              header.instructions._0_4_ = 1;
                            }
                          }
                          else {
                            header.instructions._0_4_ = 1;
                          }
                        }
                        else {
                          header.instructions._0_4_ = 1;
                        }
                      }
                      else {
                        header.instructions._0_4_ = 1;
                      }
                    }
                    else {
                      header.instructions._0_4_ = 1;
                    }
                  }
                  else {
                    ValidationState_t::diag
                              (&local_1580,
                               (ValidationState_t *)
                               binary._M_t.
                               super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                               .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,
                               SPV_ERROR_INVALID_LAYOUT,(Instruction *)0x0);
                    ValidationState_t::VkErrorID_abi_cxx11_
                              ((string *)local_15a0,
                               (ValidationState_t *)
                               binary._M_t.
                               super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                               .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,
                               0x1bbe,(char *)0x0);
                    pDVar11 = DiagnosticStream::operator<<
                                        (&local_1580,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_15a0);
                    pDVar11 = DiagnosticStream::operator<<
                                        (pDVar11,(char (*) [69])
                                                 "Module can\'t mix MeshEXT/TaskEXT with MeshNV/TaskNV Execution Model."
                                        );
                    context_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
                    std::__cxx11::string::~string((string *)local_15a0);
                    DiagnosticStream::~DiagnosticStream(&local_1580);
                    header.instructions._0_4_ = 1;
                  }
                }
                else {
                  ValidationState_t::diag
                            (&local_13a8,
                             (ValidationState_t *)
                             binary._M_t.
                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,
                             SPV_ERROR_INVALID_LAYOUT,(Instruction *)0x0);
                  pDVar11 = DiagnosticStream::operator<<
                                      (&local_13a8,
                                       (char (*) [61])
                                       "Missing required OpSamplerImageAddressingModeNV instruction."
                                      );
                  context_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
                  DiagnosticStream::~DiagnosticStream(&local_13a8);
                  header.instructions._0_4_ = 1;
                }
              }
            }
            else {
              ValidationState_t::diag
                        (&local_ff8,
                         (ValidationState_t *)
                         binary._M_t.
                         super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                         .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,
                         SPV_ERROR_INVALID_LAYOUT,(Instruction *)0x0);
              pDVar11 = DiagnosticStream::operator<<
                                  (&local_ff8,
                                   (char (*) [44])"Missing required OpMemoryModel instruction.");
              context_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
              DiagnosticStream::~DiagnosticStream(&local_ff8);
              header.instructions._0_4_ = 1;
            }
LAB_0025d5e9:
            std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
            ::~vector((vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                       *)&__range2);
          }
          else {
            header.instructions._0_4_ = 1;
            context_local._4_4_ = sVar6;
          }
          spv_context_t::~spv_context_t((spv_context_t *)&error);
        }
      }
    }
    else {
      local_488 = local_60;
      local_480 = position.line;
      local_478 = position.column;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"",&local_4a9);
      position_01.column = local_480;
      position_01.line = local_488;
      position_01.index = local_478;
      DiagnosticStream::DiagnosticStream
                (&local_470,position_01,&context->consumer,&local_4a8,SPV_ERROR_INVALID_BINARY);
      pDVar11 = DiagnosticStream::operator<<(&local_470,(char (*) [23])"Invalid SPIR-V header.");
      context_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
      DiagnosticStream::~DiagnosticStream(&local_470);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator(&local_4a9);
      header.instructions._0_4_ = 1;
    }
  }
  else {
    local_250 = local_60;
    local_248 = position.line;
    local_240 = position.column;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"",(allocator<char> *)((long)&header.instructions + 7));
    position_00.column = local_248;
    position_00.line = local_250;
    position_00.index = local_240;
    DiagnosticStream::DiagnosticStream
              (&local_238,position_00,&context->consumer,&local_270,SPV_ERROR_INVALID_BINARY);
    pDVar11 = DiagnosticStream::operator<<(&local_238,(char (*) [29])"Invalid SPIR-V magic number.")
    ;
    context_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
    DiagnosticStream::~DiagnosticStream(&local_238);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)((long)&header.instructions + 7));
    header.instructions._0_4_ = 1;
  }
  std::unique_ptr<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>::~unique_ptr
            ((unique_ptr<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_> *)
             &stack0xffffffffffffffc0);
  return context_local._4_4_;
}

Assistant:

spv_result_t ValidateBinaryUsingContextAndValidationState(
    const spv_context_t& context, const uint32_t* words, const size_t num_words,
    spv_diagnostic* pDiagnostic, ValidationState_t* vstate) {
  auto binary = std::unique_ptr<spv_const_binary_t>(
      new spv_const_binary_t{words, num_words});

  spv_endianness_t endian;
  spv_position_t position = {};
  if (spvBinaryEndianness(binary.get(), &endian)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V magic number.";
  }

  spv_header_t header;
  if (spvBinaryHeaderGet(binary.get(), endian, &header)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V header.";
  }

  if (header.version > spvVersionForTargetEnv(context.target_env)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_WRONG_VERSION)
           << "Invalid SPIR-V binary version "
           << SPV_SPIRV_VERSION_MAJOR_PART(header.version) << "."
           << SPV_SPIRV_VERSION_MINOR_PART(header.version)
           << " for target environment "
           << spvTargetEnvDescription(context.target_env) << ".";
  }

  if (header.bound > vstate->options()->universal_limits_.max_id_bound) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V.  The id bound is larger than the max id bound "
           << vstate->options()->universal_limits_.max_id_bound << ".";
  }

  // Look for OpExtension instructions and register extensions.
  // This parse should not produce any error messages. Hijack the context and
  // replace the message consumer so that we do not pollute any state in input
  // consumer.
  spv_context_t hijacked_context = context;
  hijacked_context.consumer = [](spv_message_level_t, const char*,
                                 const spv_position_t&, const char*) {};
  spvBinaryParse(&hijacked_context, vstate, words, num_words,
                 /* parsed_header = */ nullptr, ProcessExtensions,
                 /* diagnostic = */ nullptr);

  // Parse the module and perform inline validation checks. These checks do
  // not require the knowledge of the whole module.
  if (auto error = spvBinaryParse(&context, vstate, words, num_words,
                                  /*parsed_header =*/nullptr,
                                  ProcessInstruction, pDiagnostic)) {
    return error;
  }

  bool has_mask_task_nv = false;
  bool has_mask_task_ext = false;
  std::vector<Instruction*> visited_entry_points;
  for (auto& instruction : vstate->ordered_instructions()) {
    {
      // In order to do this work outside of Process Instruction we need to be
      // able to, briefly, de-const the instruction.
      Instruction* inst = const_cast<Instruction*>(&instruction);

      if (inst->opcode() == spv::Op::OpEntryPoint) {
        const auto entry_point = inst->GetOperandAs<uint32_t>(1);
        const auto execution_model = inst->GetOperandAs<spv::ExecutionModel>(0);
        const std::string desc_name = inst->GetOperandAs<std::string>(2);

        ValidationState_t::EntryPointDescription desc;
        desc.name = desc_name;

        std::vector<uint32_t> interfaces;
        for (size_t j = 3; j < inst->operands().size(); ++j)
          desc.interfaces.push_back(inst->word(inst->operand(j).offset));

        vstate->RegisterEntryPoint(entry_point, execution_model,
                                   std::move(desc));

        if (visited_entry_points.size() > 0) {
          for (const Instruction* check_inst : visited_entry_points) {
            const auto check_execution_model =
                check_inst->GetOperandAs<spv::ExecutionModel>(0);
            const std::string check_name =
                check_inst->GetOperandAs<std::string>(2);

            if (desc_name == check_name &&
                execution_model == check_execution_model) {
              return vstate->diag(SPV_ERROR_INVALID_DATA, inst)
                     << "2 Entry points cannot share the same name and "
                        "ExecutionMode.";
            }
          }
        }
        visited_entry_points.push_back(inst);

        has_mask_task_nv |= (execution_model == spv::ExecutionModel::TaskNV ||
                             execution_model == spv::ExecutionModel::MeshNV);
        has_mask_task_ext |= (execution_model == spv::ExecutionModel::TaskEXT ||
                              execution_model == spv::ExecutionModel::MeshEXT);
      }
      if (inst->opcode() == spv::Op::OpFunctionCall) {
        if (!vstate->in_function_body()) {
          return vstate->diag(SPV_ERROR_INVALID_LAYOUT, &instruction)
                 << "A FunctionCall must happen within a function body.";
        }

        const auto called_id = inst->GetOperandAs<uint32_t>(2);
        vstate->AddFunctionCallTarget(called_id);
      }

      if (vstate->in_function_body()) {
        inst->set_function(&(vstate->current_function()));
        inst->set_block(vstate->current_function().current_block());

        if (vstate->in_block() && spvOpcodeIsBlockTerminator(inst->opcode())) {
          vstate->current_function().current_block()->set_terminator(inst);
        }
      }

      if (auto error = IdPass(*vstate, inst)) return error;
    }

    if (auto error = CapabilityPass(*vstate, &instruction)) return error;
    if (auto error = ModuleLayoutPass(*vstate, &instruction)) return error;
    if (auto error = CfgPass(*vstate, &instruction)) return error;
    if (auto error = InstructionPass(*vstate, &instruction)) return error;

    // Now that all of the checks are done, update the state.
    {
      Instruction* inst = const_cast<Instruction*>(&instruction);
      vstate->RegisterInstruction(inst);
      if (inst->opcode() == spv::Op::OpTypeForwardPointer) {
        vstate->RegisterForwardPointer(inst->GetOperandAs<uint32_t>(0));
      }
    }
  }

  if (!vstate->has_memory_model_specified())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing required OpMemoryModel instruction.";

  if (vstate->in_function_body())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing OpFunctionEnd at end of module.";

  if (vstate->HasCapability(spv::Capability::BindlessTextureNV) &&
      !vstate->has_samplerimage_variable_address_mode_specified())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing required OpSamplerImageAddressingModeNV instruction.";

  if (has_mask_task_ext && has_mask_task_nv)
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << vstate->VkErrorID(7102)
           << "Module can't mix MeshEXT/TaskEXT with MeshNV/TaskNV Execution "
              "Model.";

  // Catch undefined forward references before performing further checks.
  if (auto error = ValidateForwardDecls(*vstate)) return error;

  // Calculate reachability after all the blocks are parsed, but early that it
  // can be relied on in subsequent pases.
  ReachabilityPass(*vstate);

  // ID usage needs be handled in its own iteration of the instructions,
  // between the two others. It depends on the first loop to have been
  // finished, so that all instructions have been registered. And the following
  // loop depends on all of the usage data being populated. Thus it cannot live
  // in either of those iterations.
  // It should also live after the forward declaration check, since it will
  // have problems with missing forward declarations, but give less useful error
  // messages.
  for (size_t i = 0; i < vstate->ordered_instructions().size(); ++i) {
    auto& instruction = vstate->ordered_instructions()[i];
    if (auto error = UpdateIdUse(*vstate, &instruction)) return error;
  }

  // Validate individual opcodes.
  for (size_t i = 0; i < vstate->ordered_instructions().size(); ++i) {
    auto& instruction = vstate->ordered_instructions()[i];

    // Keep these passes in the order they appear in the SPIR-V specification
    // sections to maintain test consistency.
    if (auto error = MiscPass(*vstate, &instruction)) return error;
    if (auto error = DebugPass(*vstate, &instruction)) return error;
    if (auto error = AnnotationPass(*vstate, &instruction)) return error;
    if (auto error = ExtensionPass(*vstate, &instruction)) return error;
    if (auto error = ModeSettingPass(*vstate, &instruction)) return error;
    if (auto error = TypePass(*vstate, &instruction)) return error;
    if (auto error = ConstantPass(*vstate, &instruction)) return error;
    if (auto error = MemoryPass(*vstate, &instruction)) return error;
    if (auto error = FunctionPass(*vstate, &instruction)) return error;
    if (auto error = ImagePass(*vstate, &instruction)) return error;
    if (auto error = ConversionPass(*vstate, &instruction)) return error;
    if (auto error = CompositesPass(*vstate, &instruction)) return error;
    if (auto error = ArithmeticsPass(*vstate, &instruction)) return error;
    if (auto error = BitwisePass(*vstate, &instruction)) return error;
    if (auto error = LogicalsPass(*vstate, &instruction)) return error;
    if (auto error = ControlFlowPass(*vstate, &instruction)) return error;
    if (auto error = DerivativesPass(*vstate, &instruction)) return error;
    if (auto error = AtomicsPass(*vstate, &instruction)) return error;
    if (auto error = PrimitivesPass(*vstate, &instruction)) return error;
    if (auto error = BarriersPass(*vstate, &instruction)) return error;
    // Group
    // Device-Side Enqueue
    // Pipe
    if (auto error = NonUniformPass(*vstate, &instruction)) return error;

    if (auto error = LiteralsPass(*vstate, &instruction)) return error;
    if (auto error = RayQueryPass(*vstate, &instruction)) return error;
    if (auto error = RayTracingPass(*vstate, &instruction)) return error;
    if (auto error = RayReorderNVPass(*vstate, &instruction)) return error;
    if (auto error = MeshShadingPass(*vstate, &instruction)) return error;
  }

  // Validate the preconditions involving adjacent instructions. e.g.
  // spv::Op::OpPhi must only be preceded by spv::Op::OpLabel, spv::Op::OpPhi,
  // or spv::Op::OpLine.
  if (auto error = ValidateAdjacency(*vstate)) return error;

  if (auto error = ValidateEntryPoints(*vstate)) return error;
  // CFG checks are performed after the binary has been parsed
  // and the CFGPass has collected information about the control flow
  if (auto error = PerformCfgChecks(*vstate)) return error;
  if (auto error = CheckIdDefinitionDominateUse(*vstate)) return error;
  if (auto error = ValidateDecorations(*vstate)) return error;
  if (auto error = ValidateInterfaces(*vstate)) return error;
  // TODO(dsinclair): Restructure ValidateBuiltins so we can move into the
  // for() above as it loops over all ordered_instructions internally.
  if (auto error = ValidateBuiltIns(*vstate)) return error;
  // These checks must be performed after individual opcode checks because
  // those checks register the limitation checked here.
  for (const auto& inst : vstate->ordered_instructions()) {
    if (auto error = ValidateExecutionLimitations(*vstate, &inst)) return error;
    if (auto error = ValidateSmallTypeUses(*vstate, &inst)) return error;
    if (auto error = ValidateQCOMImageProcessingTextureUsages(*vstate, &inst))
      return error;
  }

  return SPV_SUCCESS;
}